

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O0

int Aig_NodeCompareLevelsDecrease(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int Diff;
  Aig_Obj_t **pp2_local;
  Aig_Obj_t **pp1_local;
  
  pAVar3 = Aig_Regular(*pp1);
  iVar1 = Aig_ObjLevel(pAVar3);
  pAVar3 = Aig_Regular(*pp2);
  iVar2 = Aig_ObjLevel(pAVar3);
  if (iVar1 - iVar2 < 1) {
    if (iVar1 - iVar2 < 0) {
      pp1_local._4_4_ = 1;
    }
    else {
      pAVar3 = Aig_Regular(*pp1);
      iVar1 = Aig_ObjId(pAVar3);
      pAVar3 = Aig_Regular(*pp2);
      iVar2 = Aig_ObjId(pAVar3);
      if (iVar1 - iVar2 < 1) {
        if (iVar1 - iVar2 < 0) {
          pp1_local._4_4_ = 1;
        }
        else {
          pp1_local._4_4_ = 0;
        }
      }
      else {
        pp1_local._4_4_ = -1;
      }
    }
  }
  else {
    pp1_local._4_4_ = -1;
  }
  return pp1_local._4_4_;
}

Assistant:

int Aig_NodeCompareLevelsDecrease( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjLevel(Aig_Regular(*pp1)) - Aig_ObjLevel(Aig_Regular(*pp2));
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    Diff = Aig_ObjId(Aig_Regular(*pp1)) - Aig_ObjId(Aig_Regular(*pp2));
    if ( Diff > 0 )
        return -1;
    if ( Diff < 0 ) 
        return 1;
    return 0; 
}